

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

Cavs * Omega_h::unmap_cavs(Cavs *__return_storage_ptr__,LOs *a2b,Cavs *c)

{
  Write<int> WStack_78;
  Write<int> local_68;
  Graph local_58;
  Graph local_38;
  
  Write<int>::Write(&local_68,&a2b->write_);
  Graph::Graph(&local_38,&c->keys2old_elems);
  unmap_graph(&__return_storage_ptr__->keys2old_elems,(LOs *)&local_68,&local_38);
  Write<int>::Write(&WStack_78,&a2b->write_);
  Graph::Graph(&local_58,&c->keys2new_elems);
  unmap_graph(&__return_storage_ptr__->keys2new_elems,(LOs *)&WStack_78,&local_58);
  Graph::~Graph(&local_58);
  Write<int>::~Write(&WStack_78);
  Graph::~Graph(&local_38);
  Write<int>::~Write(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static Cavs unmap_cavs(LOs a2b, Cavs c) {
  return {
      unmap_graph(a2b, c.keys2old_elems), unmap_graph(a2b, c.keys2new_elems)};
}